

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls.cpp
# Opt level: O1

Error * __thiscall
ot::commissioner::DtlsSession::TryWrite(Error *__return_storage_ptr__,DtlsSession *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ErrorCode EVar2;
  _Elt_pointer aBuf;
  pointer pcVar3;
  int iVar4;
  undefined1 local_58 [8];
  _Alloc_hider local_50;
  char local_40 [16];
  
  __return_storage_ptr__->mCode = kNone;
  paVar1 = &(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p = (pointer)paVar1;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  while( true ) {
    if (__return_storage_ptr__->mCode != kNone) {
      return __return_storage_ptr__;
    }
    aBuf = (this->mSendQueue).c.
           super__Deque_base<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::MessageSubType>,_std::allocator<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::MessageSubType>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
    if ((this->mSendQueue).c.
        super__Deque_base<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::MessageSubType>,_std::allocator<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::MessageSubType>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur == aBuf) break;
    Write((Error *)local_58,this,&aBuf->first,aBuf->second);
    __return_storage_ptr__->mCode = local_58._0_4_;
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mMessage,(string *)&local_50)
    ;
    EVar2 = __return_storage_ptr__->mCode;
    if (local_50._M_p != local_40) {
      operator_delete(local_50._M_p);
    }
    iVar4 = 6;
    if (EVar2 == kNone) {
      std::
      deque<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::MessageSubType>,_std::allocator<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::MessageSubType>_>_>
      ::pop_front(&(this->mSendQueue).c);
      iVar4 = 0;
    }
    if (iVar4 != 0) {
      if ((iVar4 != 6) &&
         (pcVar3 = (__return_storage_ptr__->mMessage)._M_dataplus._M_p,
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)pcVar3 != paVar1)) {
        operator_delete(pcVar3);
      }
      return __return_storage_ptr__;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Error DtlsSession::TryWrite()
{
    Error error;
    while (error == ErrorCode::kNone && !mSendQueue.empty())
    {
        auto &messagePair = mSendQueue.front();

        SuccessOrExit(error = Write(messagePair.first, messagePair.second));
        mSendQueue.pop();
    }

exit:
    return error;
}